

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O1

void anon_unknown.dwarf_2eb82b::waves(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  short sVar1;
  Rgba *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  unsigned_short uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  ulong local_78;
  
  if (0 < h) {
    lVar9 = 0;
    local_78 = 0;
    do {
      if (0 < w) {
        dVar3 = (double)(int)local_78;
        uVar8 = 0;
        do {
          lVar10 = pixels->_sizeY;
          dVar4 = (double)(int)uVar8;
          pRVar2 = pixels->_data;
          dVar5 = sin(dVar4 * 0.1 + dVar3 * 0.1);
          dVar6 = sin(dVar4 * -0.1 + dVar3 * 0.2);
          fVar11 = (float)(dVar6 * 0.5 + 0.5 + dVar5 * 0.5 + 0.5);
          if ((fVar11 != 0.0) || (NAN(fVar11))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar11 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar7 = half::convert((int)fVar11);
            }
            else {
              uVar7 = sVar1 + (short)(((uint)fVar11 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar7 = (unsigned_short)((uint)fVar11 >> 0x10);
          }
          lVar10 = lVar10 * lVar9;
          *(unsigned_short *)((long)&pRVar2[uVar8].r._h + lVar10) = uVar7;
          *(unsigned_short *)((long)&pRVar2[uVar8].g._h + lVar10) = uVar7;
          *(unsigned_short *)((long)&pRVar2[uVar8].b._h + lVar10) = uVar7;
          dVar4 = sin(dVar4 * 1.1 + dVar3 * 0.5);
          fVar11 = (float)(dVar4 * 0.5 + 0.5);
          if ((fVar11 != 0.0) || (NAN(fVar11))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar11 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar7 = half::convert((int)fVar11);
            }
            else {
              uVar7 = sVar1 + (short)(((uint)fVar11 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar7 = (unsigned_short)((uint)fVar11 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar2[uVar8].a._h + lVar10) = uVar7;
          uVar8 = uVar8 + 1;
        } while ((uint)w != uVar8);
      }
      local_78 = local_78 + 1;
      lVar9 = lVar9 + 8;
    } while (local_78 != (uint)h);
  }
  return;
}

Assistant:

void
waves (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (0.5 + 0.5 * sin (0.1 * x + 0.1 * y)) +
		  (0.5 + 0.5 * sin (-0.1 * x + 0.2 * y));

	    p.g = p.r;
	    p.b = p.r;

	    p.a = (0.5 + 0.5 * sin (1.1 * x + 0.5 * y));
	}
    }
}